

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

Local __thiscall Wasm::WasmSignature::GetParam(WasmSignature *this,ArgSlot index)

{
  ArgSlot AVar1;
  WasmCompilationException *this_00;
  WasmType **ppWVar2;
  ArgSlot index_local;
  WasmSignature *this_local;
  
  AVar1 = GetParamCount(this);
  if (AVar1 <= index) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    AVar1 = GetParamCount(this);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Parameter %u out of range (max %u)",(ulong)index,(ulong)AVar1);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__((WriteBarrierPtr *)&this->m_params)
  ;
  return (*ppWVar2)[index];
}

Assistant:

Local WasmSignature::GetParam(Js::ArgSlot index) const
{
    if (index >= GetParamCount())
    {
        throw WasmCompilationException(_u("Parameter %u out of range (max %u)"), index, GetParamCount());
    }
    return m_params[index];
}